

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_functional.h
# Opt level: O3

void mp::WriteModelItemParameters<fmt::BasicMemoryWriter<char,std::allocator<char>>>
               (BasicMemoryWriter<char,_std::allocator<char>_> *wrt,PLConParams *plp)

{
  ulong uVar1;
  Buffer<char> *pBVar2;
  char *pcVar3;
  PLPoints *pPVar4;
  double *pdVar5;
  size_t sVar6;
  ulong uVar7;
  FormatSpec local_48;
  
  pBVar2 = (wrt->super_BasicWriter<char>).buffer_;
  sVar6 = pBVar2->size_;
  uVar7 = sVar6 + 9;
  if (pBVar2->capacity_ < uVar7) {
    (**pBVar2->_vptr_Buffer)(pBVar2,uVar7);
    sVar6 = pBVar2->size_;
  }
  builtin_strncpy(pBVar2->ptr_ + sVar6,"plpoints[",9);
  pBVar2->size_ = uVar7;
  pPVar4 = PLConParams::GetPLPoints(plp);
  if ((pPVar4->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (pPVar4->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar7 = 0;
    do {
      pBVar2 = (wrt->super_BasicWriter<char>).buffer_;
      sVar6 = pBVar2->size_;
      if (uVar7 == 0) {
        if (sVar6 == pBVar2->capacity_) {
          (**pBVar2->_vptr_Buffer)(pBVar2,sVar6 + 1);
          sVar6 = pBVar2->size_;
        }
        pBVar2->size_ = sVar6 + 1;
        pBVar2->ptr_[sVar6] = '(';
        pdVar5 = (pPVar4->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
      }
      else {
        uVar1 = sVar6 + 2;
        if (pBVar2->capacity_ < uVar1) {
          (**pBVar2->_vptr_Buffer)(pBVar2,uVar1);
          sVar6 = pBVar2->size_;
        }
        pcVar3 = pBVar2->ptr_;
        (pcVar3 + sVar6)[0] = ',';
        (pcVar3 + sVar6)[1] = ' ';
        pBVar2->size_ = uVar1;
        pBVar2 = (wrt->super_BasicWriter<char>).buffer_;
        sVar6 = pBVar2->size_;
        if (sVar6 == pBVar2->capacity_) {
          (**pBVar2->_vptr_Buffer)(pBVar2,sVar6 + 1);
          sVar6 = pBVar2->size_;
        }
        pBVar2->size_ = sVar6 + 1;
        pBVar2->ptr_[sVar6] = '(';
        pdVar5 = (pPVar4->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start + uVar7;
      }
      local_48.super_AlignSpec.super_WidthSpec.width_ = 0;
      local_48.super_AlignSpec.super_WidthSpec.fill_ = L' ';
      local_48.super_AlignSpec.align_ = ALIGN_DEFAULT;
      local_48.flags_ = 0;
      local_48.precision_ = -1;
      local_48.type_ = '\0';
      fmt::BasicWriter<char>::write_double<double>(&wrt->super_BasicWriter<char>,*pdVar5,&local_48);
      pBVar2 = (wrt->super_BasicWriter<char>).buffer_;
      sVar6 = pBVar2->size_;
      uVar1 = sVar6 + 2;
      if (pBVar2->capacity_ < uVar1) {
        (**pBVar2->_vptr_Buffer)(pBVar2,uVar1);
        sVar6 = pBVar2->size_;
      }
      pcVar3 = pBVar2->ptr_;
      (pcVar3 + sVar6)[0] = ',';
      (pcVar3 + sVar6)[1] = ' ';
      pBVar2->size_ = uVar1;
      local_48.super_AlignSpec.super_WidthSpec.width_ = 0;
      local_48.super_AlignSpec.super_WidthSpec.fill_ = L' ';
      local_48.super_AlignSpec.align_ = ALIGN_DEFAULT;
      local_48.flags_ = 0;
      local_48.precision_ = -1;
      local_48.type_ = '\0';
      fmt::BasicWriter<char>::write_double<double>
                (&wrt->super_BasicWriter<char>,
                 (pPVar4->y_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar7],&local_48);
      pBVar2 = (wrt->super_BasicWriter<char>).buffer_;
      sVar6 = pBVar2->size_;
      if (sVar6 == pBVar2->capacity_) {
        (**pBVar2->_vptr_Buffer)(pBVar2,sVar6 + 1);
        sVar6 = pBVar2->size_;
      }
      pBVar2->size_ = sVar6 + 1;
      pBVar2->ptr_[sVar6] = ')';
      uVar7 = uVar7 + 1;
    } while (uVar7 < (ulong)((long)(pPVar4->x_).super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)(pPVar4->x_).super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_start >> 3));
  }
  pBVar2 = (wrt->super_BasicWriter<char>).buffer_;
  sVar6 = pBVar2->size_;
  if (sVar6 == pBVar2->capacity_) {
    (**pBVar2->_vptr_Buffer)(pBVar2,sVar6 + 1);
    sVar6 = pBVar2->size_;
  }
  pBVar2->size_ = sVar6 + 1;
  pBVar2->ptr_[sVar6] = ']';
  return;
}

Assistant:

void WriteModelItemParameters(
    Writer& wrt, const PLConParams& plp) {
  wrt << "plpoints[";
  const auto& p = plp.GetPLPoints();
  for (size_t i=0; i<p.x_.size(); ++i) {
    if (i)
      wrt << ", ";
    wrt << '(' << p.x_[i] << ", " << p.y_[i] << ')';
  }
  wrt << ']';
}